

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleRPathRemoveCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  cmSystemToolsFileTime *t;
  ostream *poVar5;
  pointer filename;
  ulong uVar6;
  bool removed;
  cmCommand *local_1f0;
  string emsg;
  string local_1c8;
  ostringstream e;
  
  bVar3 = false;
  uVar6 = 1;
  filename = (char *)0x0;
  local_1f0 = &this->super_cmCommand;
  do {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar6) {
      if (filename == (char *)0x0) {
        std::__cxx11::string::string
                  ((string *)&e,"RPATH_REMOVE not given FILE option.",(allocator *)&emsg);
        cmCommand::SetError(local_1f0,(string *)&e);
        std::__cxx11::string::~string((string *)&e);
      }
      else {
        bVar3 = cmsys::SystemTools::FileExists(filename,true);
        if (bVar3) {
          t = cmSystemTools::FileTimeNew();
          bVar3 = cmSystemTools::FileTimeGet(filename,t);
          emsg._M_dataplus._M_p = (pointer)&emsg.field_2;
          emsg._M_string_length = 0;
          emsg.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::string((string *)&e,filename,(allocator *)&local_1c8);
          bVar4 = cmSystemTools::RemoveRPath((string *)&e,&emsg,&removed);
          std::__cxx11::string::~string((string *)&e);
          if (bVar4) {
            if (removed == true) {
              std::__cxx11::string::string
                        ((string *)&e,"Removed runtime path from \"",(allocator *)&local_1c8);
              std::__cxx11::string::append((char *)&e);
              std::__cxx11::string::append((char *)&e);
              cmMakefile::DisplayStatus(local_1f0->Makefile,_e,-1.0);
              std::__cxx11::string::~string((string *)&e);
            }
            if (bVar3) {
              cmSystemTools::FileTimeSet(filename,t);
            }
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            poVar5 = std::operator<<((ostream *)&e,
                                     "RPATH_REMOVE could not remove RPATH from file:\n");
            poVar5 = std::operator<<(poVar5,"  ");
            poVar5 = std::operator<<(poVar5,filename);
            poVar5 = std::operator<<(poVar5,"\n");
            std::operator<<(poVar5,(string *)&emsg);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(local_1f0,&local_1c8);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          }
          cmSystemTools::FileTimeDelete(t);
          std::__cxx11::string::~string((string *)&emsg);
          return bVar4;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar5 = std::operator<<((ostream *)&e,"RPATH_REMOVE given FILE \"");
        poVar5 = std::operator<<(poVar5,filename);
        std::operator<<(poVar5,"\" that does not exist.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(local_1f0,&emsg);
LAB_002de8d0:
        std::__cxx11::string::~string((string *)&emsg);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      }
      return false;
    }
    bVar2 = std::operator==(pbVar1 + uVar6,"FILE");
    bVar4 = true;
    if (!bVar2) {
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar5 = std::operator<<((ostream *)&e,"RPATH_REMOVE given unknown argument ");
        std::operator<<(poVar5,(string *)
                               ((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar6));
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(local_1f0,&emsg);
        goto LAB_002de8d0;
      }
      filename = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar6]._M_dataplus._M_p;
      bVar4 = false;
    }
    bVar3 = bVar4;
    uVar6 = (ulong)((int)uVar6 + 1);
  } while( true );
}

Assistant:

bool cmFileCommand::HandleRPathRemoveCommand(
  std::vector<std::string> const& args)
{
  // Evaluate arguments.
  const char* file = CM_NULLPTR;
  enum Doing
  {
    DoingNone,
    DoingFile
  };
  Doing doing = DoingNone;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "FILE") {
      doing = DoingFile;
    } else if (doing == DoingFile) {
      file = args[i].c_str();
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << "RPATH_REMOVE given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
    }
  }
  if (!file) {
    this->SetError("RPATH_REMOVE not given FILE option.");
    return false;
  }
  if (!cmSystemTools::FileExists(file, true)) {
    std::ostringstream e;
    e << "RPATH_REMOVE given FILE \"" << file << "\" that does not exist.";
    this->SetError(e.str());
    return false;
  }
  bool success = true;
  cmSystemToolsFileTime* ft = cmSystemTools::FileTimeNew();
  bool have_ft = cmSystemTools::FileTimeGet(file, ft);
  std::string emsg;
  bool removed;
  if (!cmSystemTools::RemoveRPath(file, &emsg, &removed)) {
    std::ostringstream e;
    /* clang-format off */
    e << "RPATH_REMOVE could not remove RPATH from file:\n"
      << "  " << file << "\n"
      << emsg;
    /* clang-format on */
    this->SetError(e.str());
    success = false;
  }
  if (success) {
    if (removed) {
      std::string message = "Removed runtime path from \"";
      message += file;
      message += "\"";
      this->Makefile->DisplayStatus(message.c_str(), -1);
    }
    if (have_ft) {
      cmSystemTools::FileTimeSet(file, ft);
    }
  }
  cmSystemTools::FileTimeDelete(ft);
  return success;
}